

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Chapter::add_string(Chapter *this,char *title,char *language,char *country)

{
  Display *dst_ptr;
  int iVar1;
  bool bVar2;
  
  bVar2 = ExpandDisplaysArray(this);
  if (bVar2) {
    iVar1 = this->displays_count_;
    this->displays_count_ = iVar1 + 1;
    dst_ptr = this->displays_ + iVar1;
    dst_ptr->title_ = (char *)0x0;
    dst_ptr->language_ = (char *)0x0;
    dst_ptr->country_ = (char *)0x0;
    bVar2 = anon_unknown_12::StrCpy(title,&dst_ptr->title_);
    if (bVar2) {
      bVar2 = anon_unknown_12::StrCpy(language,&dst_ptr->language_);
      if (bVar2) {
        bVar2 = anon_unknown_12::StrCpy(country,&dst_ptr->country_);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool Chapter::add_string(const char* title, const char* language,
                         const char* country) {
  if (!ExpandDisplaysArray())
    return false;

  Display& d = displays_[displays_count_++];
  d.Init();

  if (!d.set_title(title))
    return false;

  if (!d.set_language(language))
    return false;

  if (!d.set_country(country))
    return false;

  return true;
}